

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_buffer.cpp
# Opt level: O1

bool dxil_spv::emit_atomic_cmpxchg_instruction(Impl *impl,CallInst *instruction)

{
  StorageClass storage;
  undefined1 component_type_00;
  bool bVar1;
  Id IVar2;
  RawWidth width;
  Id IVar3;
  Builder *this;
  Value *pVVar4;
  mapped_type *meta;
  Type *pTVar5;
  BufferAccessInfo BVar6;
  Operation *this_00;
  ulong uVar7;
  uint32_t num_coords_full;
  Id image_id;
  uint32_t num_coords;
  ComponentType component_type;
  Id coords [3];
  uint32_t local_60;
  Id local_5c;
  Id local_58;
  uint32_t local_54;
  Capability local_50;
  Id local_4c;
  Id local_48 [4];
  mapped_type *local_38;
  
  this = Converter::Impl::builder(impl);
  pVVar4 = LLVMBC::Instruction::getOperand(&instruction->super_Instruction,1);
  local_58 = Converter::Impl::get_id_for_value(impl,pVVar4,0);
  if (local_58 == (impl->ags).magic_ptr_id) {
    bVar1 = emit_magic_ags_instruction(impl,instruction);
    return bVar1;
  }
  meta = std::__detail::
         _Map_base<unsigned_int,_std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::ResourceMeta>,_dxil_spv::ThreadLocalAllocator<std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::ResourceMeta>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
         ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::ResourceMeta>,_dxil_spv::ThreadLocalAllocator<std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::ResourceMeta>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                       *)&impl->handle_to_resource_meta,&local_58);
  emit_buffer_synchronization_validation(impl,instruction,AtomicRMW);
  local_48[2] = 0;
  local_48[0] = 0;
  local_48[1] = 0;
  local_60 = 0;
  local_54 = 0;
  if ((byte)(meta->kind - TypedBuffer) < 3) {
    IVar2 = meta->index_offset_id;
    pTVar5 = LLVMBC::Value::getType((Value *)instruction);
    BVar6 = build_buffer_access(impl,instruction,0,IVar2,pTVar5,1);
    local_48[0] = BVar6.index_id;
    local_54 = 1;
    local_60 = 1;
  }
  else {
    bVar1 = get_image_dimensions(impl,local_58,&local_60,&local_54);
    if (!bVar1) {
      return false;
    }
    if (3 < local_60) {
      return false;
    }
    if (local_60 != 0) {
      uVar7 = 0;
      do {
        pVVar4 = LLVMBC::Instruction::getOperand(&instruction->super_Instruction,(int)uVar7 + 2);
        IVar2 = Converter::Impl::get_id_for_value(impl,pVVar4,0);
        local_48[uVar7] = IVar2;
        uVar7 = uVar7 + 1;
      } while (uVar7 < local_60);
    }
  }
  IVar2 = spv::Builder::makeIntegerType(this,0x20,false);
  IVar2 = Converter::Impl::build_vector(impl,IVar2,local_48,local_60);
  storage = meta->storage;
  pTVar5 = LLVMBC::Value::getType((Value *)instruction);
  width = get_buffer_access_bits_per_component(impl,storage,pTVar5);
  if (width == B64) {
    local_50 = CapabilityInt64Atomics;
    std::
    _Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,dxil_spv::ThreadLocalAllocator<spv::Capability>>
    ::_M_insert_unique<spv::Capability_const&>
              ((_Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,dxil_spv::ThreadLocalAllocator<spv::Capability>>
                *)&this->capabilities,&local_50);
  }
  IVar2 = emit_atomic_access_chain(impl,meta,width,local_58,IVar2,(ComponentType *)&local_50);
  local_38 = meta;
  if (meta->non_uniform == true) {
    spv::Builder::addDecoration(this,IVar2,DecorationNonUniform,-1);
  }
  component_type_00 = (undefined1)local_50;
  IVar3 = Converter::Impl::get_type_id(impl,(undefined1)local_50,1,1,false);
  this_00 = Converter::Impl::allocate(impl,OpAtomicCompareExchange,(Value *)instruction,IVar3);
  pVVar4 = LLVMBC::Instruction::getOperand(&instruction->super_Instruction,5);
  local_5c = Converter::Impl::get_id_for_value(impl,pVVar4,0);
  pVVar4 = LLVMBC::Instruction::getOperand(&instruction->super_Instruction,6);
  IVar3 = Converter::Impl::get_id_for_value(impl,pVVar4,0);
  local_4c = IVar2;
  local_5c = Converter::Impl::fixup_store_type_atomic(impl,component_type_00,1,local_5c);
  IVar2 = Converter::Impl::fixup_store_type_atomic(impl,component_type_00,1,IVar3);
  Operation::add_id(this_00,local_4c);
  IVar3 = spv::Builder::makeIntegerType(this,0x20,false);
  IVar3 = spv::Builder::makeIntConstant(this,IVar3,1,false);
  Operation::add_id(this_00,IVar3);
  IVar3 = spv::Builder::makeIntegerType(this,0x20,false);
  IVar3 = spv::Builder::makeIntConstant(this,IVar3,0,false);
  Operation::add_id(this_00,IVar3);
  IVar3 = spv::Builder::makeIntegerType(this,0x20,false);
  IVar3 = spv::Builder::makeIntConstant(this,IVar3,0,false);
  Operation::add_id(this_00,IVar3);
  Operation::add_id(this_00,IVar2);
  Operation::add_id(this_00,local_5c);
  Converter::Impl::add(impl,this_00,local_38->rov);
  Converter::Impl::fixup_load_type_atomic(impl,component_type_00,1,(Value *)instruction);
  return true;
}

Assistant:

bool emit_atomic_cmpxchg_instruction(Converter::Impl &impl, const llvm::CallInst *instruction)
{
	auto &builder = impl.builder();
	spv::Id image_id = impl.get_id_for_value(instruction->getOperand(1));

	if (image_id == impl.ags.magic_ptr_id)
		return emit_magic_ags_instruction(impl, instruction);

	const auto &meta = impl.handle_to_resource_meta[image_id];

	emit_buffer_synchronization_validation(impl, instruction, BDAOperation::AtomicRMW);

	spv::Id coords[3] = {};
	uint32_t num_coords_full = 0, num_coords = 0;

	if (meta.kind == DXIL::ResourceKind::StructuredBuffer ||
	    meta.kind == DXIL::ResourceKind::RawBuffer ||
	    meta.kind == DXIL::ResourceKind::TypedBuffer)
	{
		auto access = build_buffer_access(impl, instruction, 0, meta.index_offset_id, instruction->getType(), 1);
		coords[0] = access.index_id;
		num_coords = 1;
		num_coords_full = 1;
	}
	else
	{
		if (!get_image_dimensions(impl, image_id, &num_coords_full, &num_coords))
			return false;

		if (num_coords_full > 3)
			return false;

		for (uint32_t i = 0; i < num_coords_full; i++)
			coords[i] = impl.get_id_for_value(instruction->getOperand(2 + i));
	}

	spv::Id coord = impl.build_vector(builder.makeUintType(32), coords, num_coords_full);

	auto width = get_buffer_access_bits_per_component(impl, meta.storage, instruction->getType());
	if (width == RawWidth::B64)
		builder.addCapability(spv::CapabilityInt64Atomics);

	DXIL::ComponentType component_type;
	spv::Id counter_ptr_id = emit_atomic_access_chain(impl, meta, width, image_id, coord, component_type);

	if (meta.non_uniform)
		builder.addDecoration(counter_ptr_id, spv::DecorationNonUniformEXT);

	Operation *op =
	    impl.allocate(spv::OpAtomicCompareExchange, instruction, impl.get_type_id(component_type, 1, 1));

	spv::Id comparison_id = impl.get_id_for_value(instruction->getOperand(5));
	spv::Id new_value_id = impl.get_id_for_value(instruction->getOperand(6));
	comparison_id = impl.fixup_store_type_atomic(component_type, 1, comparison_id);
	new_value_id = impl.fixup_store_type_atomic(component_type, 1, new_value_id);

	op->add_id(counter_ptr_id);
	op->add_id(builder.makeUintConstant(spv::ScopeDevice));
	op->add_id(builder.makeUintConstant(0));
	op->add_id(builder.makeUintConstant(0));
	op->add_id(new_value_id);
	op->add_id(comparison_id);
	impl.add(op, meta.rov);
	impl.fixup_load_type_atomic(component_type, 1, instruction);
	return true;
}